

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O2

lzma_ret lzma_stream_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,uint64_t memlimit,uint32_t flags
                   )

{
  byte bVar1;
  lzma_ret lVar2;
  lzma_stream_coder *coder;
  
  if ((code *)next->init != lzma_stream_decoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_decoder_init;
  if (0x1f < flags) {
    return LZMA_OPTIONS_ERROR;
  }
  coder = (lzma_stream_coder *)next->coder;
  if (coder == (lzma_stream_coder *)0x0) {
    coder = (lzma_stream_coder *)lzma_alloc(0x580,allocator);
    if (coder == (lzma_stream_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = coder;
    next->code = stream_decode;
    next->end = stream_decoder_end;
    next->get_check = stream_decoder_get_check;
    next->memconfig = stream_decoder_memconfig;
    (coder->block_decoder).coder = (void *)0x0;
    (coder->block_decoder).id = 0xffffffffffffffff;
    (coder->block_decoder).init = 0;
    (coder->block_decoder).code = (lzma_code_function)0x0;
    (coder->block_decoder).end = (lzma_end_function)0x0;
    (coder->block_decoder).get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
    (coder->block_decoder).update =
         (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
    (coder->block_decoder).get_check = (_func_lzma_check_void_ptr *)0x0;
    (coder->block_decoder).memconfig =
         (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    coder->index_hash = (lzma_index_hash *)0x0;
  }
  coder->memlimit = memlimit + (memlimit == 0);
  coder->memusage = 0x8000;
  bVar1 = (byte)flags;
  coder->tell_no_check = (_Bool)(bVar1 & 1);
  coder->tell_unsupported_check = (_Bool)(bVar1 >> 1 & 1);
  coder->tell_any_check = (_Bool)(bVar1 >> 2 & 1);
  coder->ignore_check = 0xf < flags;
  coder->concatenated = (_Bool)(bVar1 >> 3 & 1);
  coder->first_stream = true;
  lVar2 = stream_decoder_reset(coder,allocator);
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_stream_decoder_init(
		lzma_next_coder *next, const lzma_allocator *allocator,
		uint64_t memlimit, uint32_t flags)
{
	lzma_next_coder_init(&lzma_stream_decoder_init, next, allocator);

	if (flags & ~LZMA_SUPPORTED_FLAGS)
		return LZMA_OPTIONS_ERROR;

	lzma_stream_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &stream_decode;
		next->end = &stream_decoder_end;
		next->get_check = &stream_decoder_get_check;
		next->memconfig = &stream_decoder_memconfig;

		coder->block_decoder = LZMA_NEXT_CODER_INIT;
		coder->index_hash = NULL;
	}

	coder->memlimit = my_max(1, memlimit);
	coder->memusage = LZMA_MEMUSAGE_BASE;
	coder->tell_no_check = (flags & LZMA_TELL_NO_CHECK) != 0;
	coder->tell_unsupported_check
			= (flags & LZMA_TELL_UNSUPPORTED_CHECK) != 0;
	coder->tell_any_check = (flags & LZMA_TELL_ANY_CHECK) != 0;
	coder->ignore_check = (flags & LZMA_IGNORE_CHECK) != 0;
	coder->concatenated = (flags & LZMA_CONCATENATED) != 0;
	coder->first_stream = true;

	return stream_decoder_reset(coder, allocator);
}